

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

void __thiscall Fl_Pixmap::set_data(Fl_Pixmap *this,char **p)

{
  int iVar1;
  undefined8 in_RAX;
  int ncolors;
  int height;
  undefined8 local_28;
  
  if (p != (char **)0x0) {
    local_28 = in_RAX;
    __isoc99_sscanf(*p,"%*d%d%d",(long)&local_28 + 4,&local_28);
    iVar1 = 2;
    if (-1 < (int)local_28) {
      iVar1 = (int)local_28 + 1;
    }
    (this->super_Fl_Image).data_ = p;
    (this->super_Fl_Image).count_ = iVar1 + local_28._4_4_;
  }
  return;
}

Assistant:

void Fl_Pixmap::set_data(const char * const * p) {
  int	height,		// Number of lines in image
	ncolors;	// Number of colors in image

  if (p) {
    sscanf(p[0],"%*d%d%d", &height, &ncolors);
    if (ncolors < 0) data(p, height + 2);
    else data(p, height + ncolors + 1);
  }
}